

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[10],Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [10],MAP_TYPE *RestArgs,char (*RestArgs_1) [63],MAP_TYPE *RestArgs_2
               )

{
  MAP_TYPE *RestArgs_local_2;
  char (*RestArgs_local_1) [63];
  MAP_TYPE *RestArgs_local;
  char (*FirstArg_local) [10];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[10]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
            (ss,RestArgs,RestArgs_1,RestArgs_2);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}